

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O1

ostream * notch::io::operator<<(ostream *out,Array *xs)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  bool bVar4;
  
  pfVar1 = xs->_M_data;
  bVar4 = xs->_M_size == 0;
  pfVar3 = pfVar1;
  if (bVar4) {
    pfVar3 = (float *)0x0;
  }
  pfVar2 = pfVar1 + xs->_M_size;
  if (bVar4) {
    pfVar2 = (float *)0x0;
  }
  if (pfVar3 != pfVar2) {
    do {
      if (bVar4) {
        pfVar1 = (float *)0x0;
      }
      if (pfVar3 != pfVar1) {
        std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
      }
      std::ostream::_M_insert<double>((double)*pfVar3);
      pfVar3 = pfVar3 + 1;
      pfVar1 = xs->_M_data;
      bVar4 = xs->_M_size == 0;
    } while ((bVar4) || (pfVar3 != pfVar1 + xs->_M_size));
  }
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const Array &xs) {
    for (auto it = std::begin(xs); it != std::end(xs); ++it) {
        if (it != std::begin(xs)) {
            out << " ";
        }
        out << *it;
    }
    return out;
}